

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O0

menu * menu_new_action(menu_action *acts,size_t n)

{
  menu_iter *iter;
  menu *menu;
  menu *m;
  size_t n_local;
  menu_action *acts_local;
  
  iter = menu_find_iter(MN_ITER_ACTIONS);
  menu = menu_new(MN_SKIN_SCROLL,iter);
  menu_setpriv(menu,(int)n,acts);
  return menu;
}

Assistant:

struct menu *menu_new_action(menu_action *acts, size_t n)
{
	struct menu *m = menu_new(MN_SKIN_SCROLL, menu_find_iter(MN_ITER_ACTIONS));
	menu_setpriv(m, n, acts);
	return m;
}